

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

ostream * ClipperLib::operator<<(ostream *s,IntPoint *p)

{
  ostream *poVar1;
  IntPoint *p_local;
  ostream *s_local;
  
  poVar1 = std::operator<<(s,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->X);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->Y);
  std::operator<<(poVar1,")");
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const IntPoint &p)
{
  s << "(" << p.X << "," << p.Y << ")";
  return s;
}